

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<int,double,double,double,double>
               (ostream *out,char *fmt,int *args,double *args_1,double *args_2,double *args_3,
               double *args_4)

{
  int *in_RCX;
  double *in_RSI;
  FormatListRef in_RDI;
  double *in_R8;
  double *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = (ostream *)&stack0xffffffffffffff70;
  makeFormatList<int,double,double,double,double>(in_RCX,in_R8,in_R9,(double *)out_00,in_RSI);
  vformat(out_00,(char *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}